

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_setup.h
# Opt level: O2

void SetupStyleFromHue(void)

{
  float *out_g;
  float *out_b;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ImGuiStyle *pIVar4;
  float fVar5;
  ImColor IVar6;
  ImColor IVar7;
  ImColor IVar8;
  ImColor IVar9;
  float dummy;
  ImVec4 rgb;
  float local_98;
  float local_78;
  float local_58;
  
  ImGui::Begin("Hue Style",(bool *)0x0,0);
  ImGui::SliderInt("master hue",&SetupStyleFromHue::hue,0,0xff,"%.0f");
  out_g = &rgb.y;
  rgb.x = 0.0;
  rgb.y = 0.0;
  rgb.z = 0.0;
  rgb.w = 0.0;
  ImGui::ColorEditMode(1);
  out_b = &rgb.z;
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_main_sat,
             SetupStyleFromHue::col_main_val,&rgb.x,out_g,out_b);
  ImGui::ColorEdit3("main",&rgb.x);
  ImGui::ColorConvertRGBtoHSV
            (rgb.x,rgb.y,rgb.z,&dummy,&SetupStyleFromHue::col_main_sat,
             &SetupStyleFromHue::col_main_val);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_area_sat,
             SetupStyleFromHue::col_area_val,&rgb.x,out_g,out_b);
  ImGui::ColorEdit3("area",&rgb.x);
  ImGui::ColorConvertRGBtoHSV
            (rgb.x,rgb.y,rgb.z,&dummy,&SetupStyleFromHue::col_area_sat,
             &SetupStyleFromHue::col_area_val);
  ImGui::ColorConvertHSVtoRGB
            ((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_back_sat,
             SetupStyleFromHue::col_back_val,&rgb.x,out_g,out_b);
  ImGui::ColorEdit3("back",&rgb.x);
  ImGui::ColorConvertRGBtoHSV
            (rgb.x,rgb.y,rgb.z,&dummy,&SetupStyleFromHue::col_back_sat,
             &SetupStyleFromHue::col_back_val);
  ImGui::End();
  pIVar4 = ImGui::GetStyle();
  IVar6 = ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,0.078431375,0.92156863,1.0);
  uVar2 = IVar6.Value._0_8_;
  IVar7 = ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_main_sat,
                       SetupStyleFromHue::col_main_val,1.0);
  uVar3 = IVar7.Value._0_8_;
  IVar8 = ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_back_sat,
                       SetupStyleFromHue::col_back_val,1.0);
  IVar9 = ImColor::HSV((float)SetupStyleFromHue::hue / 255.0,SetupStyleFromHue::col_area_sat,
                       SetupStyleFromHue::col_area_val,1.0);
  fVar5 = IVar9.Value.z;
  pIVar4->Colors[0].x = (float)(int)uVar2;
  pIVar4->Colors[0].y = (float)(int)((ulong)uVar2 >> 0x20);
  local_78 = IVar6.Value.z;
  pIVar4->Colors[0].z = local_78;
  pIVar4->Colors[0].w = 1.0;
  pIVar4->Colors[1].x = (float)(int)uVar2;
  pIVar4->Colors[1].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[1].z = local_78;
  pIVar4->Colors[1].w = 0.58;
  pIVar4->Colors[2].x = (float)(int)IVar8.Value._0_8_;
  pIVar4->Colors[2].y = (float)(int)((ulong)IVar8.Value._0_8_ >> 0x20);
  local_98 = IVar8.Value.z;
  pIVar4->Colors[2].z = local_98;
  pIVar4->Colors[2].w = 1.0;
  uVar1 = IVar9.Value._0_8_;
  pIVar4->Colors[3].x = (float)(int)uVar1;
  pIVar4->Colors[3].y = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar4->Colors[3].z = fVar5;
  pIVar4->Colors[3].w = 0.0;
  pIVar4->Colors[5].x = (float)(int)uVar2;
  pIVar4->Colors[5].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[5].z = local_78;
  pIVar4->Colors[5].w = 0.3;
  pIVar4->Colors[6].x = 0.0;
  pIVar4->Colors[6].y = 0.0;
  pIVar4->Colors[6].z = 0.0;
  pIVar4->Colors[6].w = 0.0;
  pIVar4->Colors[7].x = (float)(int)uVar1;
  pIVar4->Colors[7].y = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar4->Colors[7].z = fVar5;
  pIVar4->Colors[7].w = 1.0;
  pIVar4->Colors[8].x = (float)(int)uVar3;
  pIVar4->Colors[8].y = (float)(int)((ulong)uVar3 >> 0x20);
  local_58 = IVar7.Value.z;
  pIVar4->Colors[8].z = local_58;
  pIVar4->Colors[8].w = 0.68;
  pIVar4->Colors[9].x = (float)(int)uVar3;
  pIVar4->Colors[9].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[9].z = local_58;
  pIVar4->Colors[9].w = 1.0;
  pIVar4->Colors[10].x = (float)(int)uVar3;
  pIVar4->Colors[10].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[10].z = local_58;
  pIVar4->Colors[10].w = 0.45;
  pIVar4->Colors[0xb].x = (float)(int)uVar3;
  pIVar4->Colors[0xb].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0xb].z = local_58;
  pIVar4->Colors[0xb].w = 0.35;
  pIVar4->Colors[0xc].x = (float)(int)uVar3;
  pIVar4->Colors[0xc].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0xc].z = local_58;
  pIVar4->Colors[0xc].w = 0.78;
  pIVar4->Colors[0xd].x = (float)(int)uVar1;
  pIVar4->Colors[0xd].y = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar4->Colors[0xd].z = fVar5;
  pIVar4->Colors[0xd].w = 0.57;
  pIVar4->Colors[0xe].x = (float)(int)uVar1;
  pIVar4->Colors[0xe].y = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar4->Colors[0xe].z = fVar5;
  pIVar4->Colors[0xe].w = 1.0;
  pIVar4->Colors[0xf].x = (float)(int)uVar3;
  pIVar4->Colors[0xf].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0xf].z = local_58;
  pIVar4->Colors[0xf].w = 0.31;
  pIVar4->Colors[0x10].x = (float)(int)uVar3;
  pIVar4->Colors[0x10].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x10].z = local_58;
  pIVar4->Colors[0x10].w = 0.78;
  pIVar4->Colors[0x11].x = (float)(int)uVar3;
  pIVar4->Colors[0x11].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x11].z = local_58;
  pIVar4->Colors[0x11].w = 1.0;
  pIVar4->Colors[0x12].x = (float)(int)uVar1;
  pIVar4->Colors[0x12].y = (float)(int)((ulong)uVar1 >> 0x20);
  pIVar4->Colors[0x12].z = fVar5;
  pIVar4->Colors[0x12].w = 1.0;
  pIVar4->Colors[0x13].x = (float)(int)uVar3;
  pIVar4->Colors[0x13].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x13].z = local_58;
  pIVar4->Colors[0x13].w = 0.8;
  pIVar4->Colors[0x14].x = (float)(int)uVar3;
  pIVar4->Colors[0x14].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x14].z = local_58;
  pIVar4->Colors[0x14].w = 0.24;
  pIVar4->Colors[0x15].x = (float)(int)uVar3;
  pIVar4->Colors[0x15].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x15].z = local_58;
  pIVar4->Colors[0x15].w = 1.0;
  pIVar4->Colors[0x16].x = (float)(int)uVar3;
  pIVar4->Colors[0x16].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x16].z = local_58;
  pIVar4->Colors[0x16].w = 0.44;
  pIVar4->Colors[0x17].x = (float)(int)uVar3;
  pIVar4->Colors[0x17].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x17].z = local_58;
  pIVar4->Colors[0x17].w = 0.86;
  pIVar4->Colors[0x18].x = (float)(int)uVar3;
  pIVar4->Colors[0x18].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x18].z = local_58;
  pIVar4->Colors[0x18].w = 1.0;
  pIVar4->Colors[0x19].x = (float)(int)uVar3;
  pIVar4->Colors[0x19].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x19].z = local_58;
  pIVar4->Colors[0x19].w = 0.76;
  pIVar4->Colors[0x1a].x = (float)(int)uVar3;
  pIVar4->Colors[0x1a].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x1a].z = local_58;
  pIVar4->Colors[0x1a].w = 0.86;
  pIVar4->Colors[0x1b].x = (float)(int)uVar3;
  pIVar4->Colors[0x1b].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x1b].z = local_58;
  pIVar4->Colors[0x1b].w = 1.0;
  pIVar4->Colors[0x1c].x = (float)(int)uVar2;
  pIVar4->Colors[0x1c].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x1c].z = local_78;
  pIVar4->Colors[0x1c].w = 0.32;
  pIVar4->Colors[0x1d].x = (float)(int)uVar2;
  pIVar4->Colors[0x1d].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x1d].z = local_78;
  pIVar4->Colors[0x1d].w = 0.78;
  pIVar4->Colors[0x1e].x = (float)(int)uVar2;
  pIVar4->Colors[0x1e].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x1e].z = local_78;
  pIVar4->Colors[0x1e].w = 1.0;
  pIVar4->Colors[0x1f].x = (float)(int)uVar3;
  pIVar4->Colors[0x1f].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x1f].z = local_58;
  pIVar4->Colors[0x1f].w = 0.2;
  pIVar4->Colors[0x20].x = (float)(int)uVar3;
  pIVar4->Colors[0x20].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x20].z = local_58;
  pIVar4->Colors[0x20].w = 0.78;
  pIVar4->Colors[0x21].x = (float)(int)uVar3;
  pIVar4->Colors[0x21].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x21].z = local_58;
  pIVar4->Colors[0x21].w = 1.0;
  pIVar4->Colors[0x22].x = (float)(int)uVar2;
  pIVar4->Colors[0x22].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x22].z = local_78;
  pIVar4->Colors[0x22].w = 0.16;
  pIVar4->Colors[0x23].x = (float)(int)uVar2;
  pIVar4->Colors[0x23].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x23].z = local_78;
  pIVar4->Colors[0x23].w = 0.39;
  pIVar4->Colors[0x24].x = (float)(int)uVar2;
  pIVar4->Colors[0x24].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x24].z = local_78;
  pIVar4->Colors[0x24].w = 1.0;
  pIVar4->Colors[0x25].x = (float)(int)uVar2;
  pIVar4->Colors[0x25].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x25].z = local_78;
  pIVar4->Colors[0x25].w = 0.63;
  pIVar4->Colors[0x26].x = (float)(int)uVar3;
  pIVar4->Colors[0x26].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x26].z = local_58;
  pIVar4->Colors[0x26].w = 1.0;
  pIVar4->Colors[0x27].x = (float)(int)uVar2;
  pIVar4->Colors[0x27].y = (float)(int)((ulong)uVar2 >> 0x20);
  pIVar4->Colors[0x27].z = local_78;
  pIVar4->Colors[0x27].w = 0.63;
  pIVar4->Colors[0x28].x = (float)(int)uVar3;
  pIVar4->Colors[0x28].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x28].z = local_58;
  pIVar4->Colors[0x28].w = 1.0;
  pIVar4->Colors[0x29].x = (float)(int)uVar3;
  pIVar4->Colors[0x29].y = (float)(int)((ulong)uVar3 >> 0x20);
  pIVar4->Colors[0x29].z = local_58;
  *(undefined8 *)&pIVar4->Colors[0x29].w = 0x3e4ccccd3edc28f6;
  pIVar4->Colors[0x2a].y = 0.2;
  pIVar4->Colors[0x2a].z = 0.2;
  pIVar4->Colors[0x2a].w = 0.35;
  return;
}

Assistant:

void SetupStyleFromHue()
{
#if 1
    // FIXME: those should become parameters to the function
    static int hue = 140;
    static float col_main_sat = 180.f/255.f;
    static float col_main_val = 161.f/255.f;
    static float col_area_sat = 124.f/255.f;
    static float col_area_val = 100.f/255.f;
    static float col_back_sat = 59.f/255.f;
    static float col_back_val = 40.f/255.f;

    ImGui::Begin("Hue Style");
    ImGui::SliderInt("master hue", &hue, 0, 255);

    float dummy;
    ImVec4 rgb;
    ImGui::ColorEditMode(ImGuiColorEditMode_HSV);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_main_sat, col_main_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("main", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_main_sat, col_main_val);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_area_sat, col_area_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("area", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_area_sat, col_area_val);

    ImGui::ColorConvertHSVtoRGB(hue/255.f, col_back_sat, col_back_val, rgb.x, rgb.y, rgb.z);
    ImGui::ColorEdit3("back", &rgb.x);
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, dummy, col_back_sat, col_back_val);

    ImGui::End();
#endif

    ImGuiStyle& style = ImGui::GetStyle();

    ImVec4 col_text = ImColor::HSV(hue/255.f,  20.f/255.f, 235.f/255.f);
    ImVec4 col_main = ImColor::HSV(hue/255.f, col_main_sat, col_main_val);
    ImVec4 col_back = ImColor::HSV(hue/255.f, col_back_sat, col_back_val);
    ImVec4 col_area = ImColor::HSV(hue/255.f, col_area_sat, col_area_val);

    style.Colors[ImGuiCol_Text]                  = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_TextDisabled]          = ImVec4(col_text.x, col_text.y, col_text.z, 0.58f);
    style.Colors[ImGuiCol_WindowBg]              = ImVec4(col_back.x, col_back.y, col_back.z, 1.00f);
    style.Colors[ImGuiCol_ChildWindowBg]         = ImVec4(col_area.x, col_area.y, col_area.z, 0.00f);
    style.Colors[ImGuiCol_Border]                = ImVec4(col_text.x, col_text.y, col_text.z, 0.30f);
    style.Colors[ImGuiCol_BorderShadow]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    style.Colors[ImGuiCol_FrameBg]               = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_FrameBgHovered]        = ImVec4(col_main.x, col_main.y, col_main.z, 0.68f);
    style.Colors[ImGuiCol_FrameBgActive]         = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_TitleBg]               = ImVec4(col_main.x, col_main.y, col_main.z, 0.45f);
    style.Colors[ImGuiCol_TitleBgCollapsed]      = ImVec4(col_main.x, col_main.y, col_main.z, 0.35f);
    style.Colors[ImGuiCol_TitleBgActive]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_MenuBarBg]             = ImVec4(col_area.x, col_area.y, col_area.z, 0.57f);
    style.Colors[ImGuiCol_ScrollbarBg]           = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_ScrollbarGrab]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.31f);
    style.Colors[ImGuiCol_ScrollbarGrabHovered]  = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_ScrollbarGrabActive]   = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_ComboBg]               = ImVec4(col_area.x, col_area.y, col_area.z, 1.00f);
    style.Colors[ImGuiCol_CheckMark]             = ImVec4(col_main.x, col_main.y, col_main.z, 0.80f);
    style.Colors[ImGuiCol_SliderGrab]            = ImVec4(col_main.x, col_main.y, col_main.z, 0.24f);
    style.Colors[ImGuiCol_SliderGrabActive]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Button]                = ImVec4(col_main.x, col_main.y, col_main.z, 0.44f);
    style.Colors[ImGuiCol_ButtonHovered]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.86f);
    style.Colors[ImGuiCol_ButtonActive]          = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Header]                = ImVec4(col_main.x, col_main.y, col_main.z, 0.76f);
    style.Colors[ImGuiCol_HeaderHovered]         = ImVec4(col_main.x, col_main.y, col_main.z, 0.86f);
    style.Colors[ImGuiCol_HeaderActive]          = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_Column]                = ImVec4(col_text.x, col_text.y, col_text.z, 0.32f);
    style.Colors[ImGuiCol_ColumnHovered]         = ImVec4(col_text.x, col_text.y, col_text.z, 0.78f);
    style.Colors[ImGuiCol_ColumnActive]          = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_ResizeGrip]            = ImVec4(col_main.x, col_main.y, col_main.z, 0.20f);
    style.Colors[ImGuiCol_ResizeGripHovered]     = ImVec4(col_main.x, col_main.y, col_main.z, 0.78f);
    style.Colors[ImGuiCol_ResizeGripActive]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_CloseButton]           = ImVec4(col_text.x, col_text.y, col_text.z, 0.16f);
    style.Colors[ImGuiCol_CloseButtonHovered]    = ImVec4(col_text.x, col_text.y, col_text.z, 0.39f);
    style.Colors[ImGuiCol_CloseButtonActive]     = ImVec4(col_text.x, col_text.y, col_text.z, 1.00f);
    style.Colors[ImGuiCol_PlotLines]             = ImVec4(col_text.x, col_text.y, col_text.z, 0.63f);
    style.Colors[ImGuiCol_PlotLinesHovered]      = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_PlotHistogram]         = ImVec4(col_text.x, col_text.y, col_text.z, 0.63f);
    style.Colors[ImGuiCol_PlotHistogramHovered]  = ImVec4(col_main.x, col_main.y, col_main.z, 1.00f);
    style.Colors[ImGuiCol_TextSelectedBg]        = ImVec4(col_main.x, col_main.y, col_main.z, 0.43f);
    //style.Colors[ImGuiCol_TooltipBg]             = ImVec4(col_main.x, col_main.y, col_main.z, 0.92f);
    style.Colors[ImGuiCol_ModalWindowDarkening]  = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}